

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  u32 *page0;
  u32 *local_20;
  
  iVar2 = walIndexPage(pWal,0,&local_20);
  if (iVar2 != 0) {
    return iVar2;
  }
  if ((local_20 != (u32 *)0x0) && (iVar2 = walIndexTryHdr(pWal,pChanged), iVar2 == 0)) {
    bVar1 = true;
    iVar2 = 0;
    goto LAB_00123086;
  }
  if ((pWal->readOnly & 2) == 0) {
    iVar2 = 0;
    if (pWal->exclusiveMode == '\0') {
      iVar2 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
    }
    if (iVar2 != 0) {
LAB_0012301d:
      bVar1 = false;
      goto LAB_00123086;
    }
    pWal->writeLock = '\x01';
    iVar2 = 0;
    iVar3 = walIndexPage(pWal,0,&local_20);
    if (iVar3 == 0) {
      iVar3 = walIndexTryHdr(pWal,pChanged);
      if (iVar3 == 0) {
        bVar1 = true;
      }
      else {
        iVar2 = walIndexRecover(pWal);
        *pChanged = 1;
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
      iVar2 = iVar3;
    }
    pWal->writeLock = '\0';
    if (pWal->exclusiveMode != '\0') goto LAB_00123086;
    iVar3 = 9;
  }
  else {
    iVar2 = 0;
    if (pWal->exclusiveMode == '\0') {
      iVar2 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,6);
    }
    if (iVar2 != 0) goto LAB_0012301d;
    iVar2 = 0x108;
    bVar1 = false;
    if (pWal->exclusiveMode != '\0') goto LAB_00123086;
    iVar3 = 5;
    bVar1 = false;
  }
  (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,iVar3);
LAB_00123086:
  if ((bVar1) && ((pWal->hdr).iVersion != 0x2de218)) {
    iVar2 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xdc68,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
  }
  return iVar2;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    return rc;
  };
  assert( page0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->readOnly & WAL_SHM_RDONLY ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }

  return rc;
}